

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O1

type_conflict1 __thiscall chaiscript::parse_num<double>(chaiscript *this,string_view t_str)

{
  chaiscript cVar1;
  int iVar2;
  chaiscript *pcVar3;
  const_iterator __begin2;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (this == (chaiscript *)0x0) {
    dVar7 = 0.0;
    iVar2 = 0;
    dVar4 = 0.0;
  }
  else {
    pcVar3 = (chaiscript *)0x0;
    dVar7 = 0.0;
    dVar6 = 0.0;
    iVar2 = 0;
    dVar5 = 0.0;
    do {
      cVar1 = pcVar3[t_str._M_len];
      if ((byte)cVar1 - 0x30 < 10) {
        if (10.0 <= dVar6) {
          dVar4 = (double)((char)cVar1 + -0x30) / dVar6;
          dVar6 = dVar6 * 10.0;
          dVar4 = dVar5 + dVar4;
        }
        else {
          dVar4 = dVar5 * 10.0 + (double)((char)cVar1 + -0x30);
        }
      }
      else {
        dVar4 = dVar5;
        if ((byte)cVar1 < 0x45) {
          if (cVar1 == (chaiscript)0x2d) {
            iVar2 = -1;
          }
          else if (cVar1 == (chaiscript)0x2e) {
            dVar6 = 10.0;
          }
        }
        else if ((cVar1 == (chaiscript)0x45) || (cVar1 == (chaiscript)0x65)) {
          dVar6 = 0.0;
          iVar2 = 1;
          dVar4 = 0.0;
          dVar7 = dVar5;
        }
      }
      pcVar3 = pcVar3 + 1;
      dVar5 = dVar4;
    } while (this != pcVar3);
  }
  if (iVar2 != 0) {
    dVar4 = pow(10.0,dVar4 * (double)iVar2);
    dVar4 = dVar7 * dVar4;
  }
  return dVar4;
}

Assistant:

[[nodiscard]] auto parse_num(const std::string_view t_str) -> typename std::enable_if<!std::is_integral<T>::value, T>::type {
    T t = 0;
    T base{};
    T decimal_place = 0;
    int exponent = 0;

    for (const auto c : t_str) {
      switch (c) {
        case '.':
          decimal_place = 10;
          break;
        case 'e':
        case 'E':
          exponent = 1;
          decimal_place = 0;
          base = t;
          t = 0;
          break;
        case '-':
          exponent = -1;
          break;
        case '+':
          break;
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
          if (decimal_place < 10) {
            t *= 10;
            t += static_cast<T>(c - '0');
          } else {
            t += static_cast<T>(c - '0') / decimal_place;
            decimal_place *= 10;
          }
          break;
        default:
          break;
      }
    }
    return exponent ? base * std::pow(T(10), t * static_cast<T>(exponent)) : t;
  }